

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::_::BTreeImpl::Parent::insertAfter(Parent *this,uint i,uint splitKey,uint child)

{
  memmove(this->keys + (ulong)i + 1,this->keys + i,(ulong)(i + 1) * -4 + 0x1c);
  ((Parent *)(this->keys + (ulong)i + 1 + -1))->unused = splitKey + 1;
  memmove(this->children + (ulong)i + 2,this->children + (ulong)i + 1,(ulong)(i + 2) * -4 + 0x20);
  this->children[i + 1] = child;
  return;
}

Assistant:

void BTreeImpl::Parent::insertAfter(uint i, uint splitKey, uint child) {
  KJ_IREQUIRE(children[Parent::NCHILDREN - 1] == 0);  // check not full

  amove(keys + i + 1, keys + i, Parent::NKEYS - (i + 1));
  keys[i] = splitKey;

  amove(children + i + 2, children + i + 1, Parent::NCHILDREN - (i + 2));
  children[i + 1] = child;
}